

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

ExprList * exprListAppendList(Parse *pParse,ExprList *pList,ExprList *pAppend,int bIntToNull)

{
  sqlite3 *db;
  int iVar1;
  long lVar2;
  Expr *p;
  Expr *p_00;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pAppend != (ExprList *)0x0) {
    if (pList == (ExprList *)0x0) {
      lVar2 = 0;
    }
    else {
      lVar2 = (long)pList->nExpr;
    }
    lVar4 = 0x18;
    for (lVar3 = 0; lVar3 < pAppend->nExpr; lVar3 = lVar3 + 1) {
      db = pParse->db;
      p = sqlite3ExprDup(db,*(Expr **)((long)(pAppend->a + -1) + lVar4),0);
      if (db->mallocFailed != '\0') {
        sqlite3ExprDelete(db,p);
        break;
      }
      if (bIntToNull != 0) {
        p_00 = sqlite3ExprSkipCollateAndLikely(p);
        iVar1 = sqlite3ExprIsInteger(p_00,&local_3c,(Parse *)0x0);
        if (iVar1 != 0) {
          p_00->op = 'z';
          p_00->flags = p_00->flags & 0xcffff7ff;
          (p_00->u).zToken = (char *)0x0;
        }
      }
      pList = sqlite3ExprListAppend(pParse,pList,p);
      if (pList != (ExprList *)0x0) {
        *(undefined1 *)((long)pList->a + lVar4 + lVar2 * 0x18 + -8) =
             *(undefined1 *)((long)pAppend->a + lVar4 + -8);
      }
      lVar4 = lVar4 + 0x18;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pList;
  }
  __stack_chk_fail();
}

Assistant:

static ExprList *exprListAppendList(
  Parse *pParse,          /* Parsing context */
  ExprList *pList,        /* List to which to append. Might be NULL */
  ExprList *pAppend,      /* List of values to append. Might be NULL */
  int bIntToNull
){
  if( pAppend ){
    int i;
    int nInit = pList ? pList->nExpr : 0;
    for(i=0; i<pAppend->nExpr; i++){
      sqlite3 *db = pParse->db;
      Expr *pDup = sqlite3ExprDup(db, pAppend->a[i].pExpr, 0);
      if( db->mallocFailed ){
        sqlite3ExprDelete(db, pDup);
        break;
      }
      if( bIntToNull ){
        int iDummy;
        Expr *pSub;
        pSub = sqlite3ExprSkipCollateAndLikely(pDup);
        if( sqlite3ExprIsInteger(pSub, &iDummy, 0) ){
          pSub->op = TK_NULL;
          pSub->flags &= ~(EP_IntValue|EP_IsTrue|EP_IsFalse);
          pSub->u.zToken = 0;
        }
      }
      pList = sqlite3ExprListAppend(pParse, pList, pDup);
      if( pList ) pList->a[nInit+i].fg.sortFlags = pAppend->a[i].fg.sortFlags;
    }
  }
  return pList;
}